

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O0

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
           *this,reference value)

{
  uint32_t uVar1;
  TCompactProtocolT<duckdb::SimpleReadTransport> *in_RDI;
  uint32_t ret;
  bool b;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  byte bVar2;
  _Bit_reference local_10;
  
  bVar2 = 0;
  uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readBool
                    (in_RDI,(bool *)(ulong)CONCAT34(in_stack_ffffffffffffffe4,
                                                    in_stack_ffffffffffffffe0));
  std::_Bit_reference::operator=(&local_10,(bool)(bVar2 & 1));
  return uVar1;
}

Assistant:

uint32_t readBool(duckdb::vector<bool>::reference value) {
    bool b = false;
    uint32_t ret = static_cast<Protocol_*>(this)->readBool(b);
    value = b;
    return ret;
  }